

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O3

void duckdb_je_malloc_tsd_boot1(void)

{
  tsd_t *tsd;
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_0249db70);
  if ((tsd->state).repr != '\0') {
    duckdb_je_tsd_fetch_slow(tsd,false);
  }
  duckdb_je_tsd_slow_update(tsd);
  return;
}

Assistant:

void
malloc_tsd_boot1(void) {
	tsd_boot1();
	tsd_t *tsd = tsd_fetch();
	/* malloc_slow has been set properly.  Update tsd_slow. */
	tsd_slow_update(tsd);
}